

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O3

maze_path * __thiscall
HBF::search(maze_path *__return_storage_ptr__,HBF *this,
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *grid,vector<double,_std::allocator<double>_> *start,
           vector<int,_std::allocator<int>_> *goal)

{
  maze_s *__src;
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  pointer piVar4;
  double *pdVar5;
  pointer pvVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  maze_s state;
  pointer pmVar11;
  ulong uVar12;
  ostream *poVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  pointer pmVar22;
  int iVar23;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined4 uVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined4 uVar31;
  undefined4 uVar32;
  initializer_list<HBF::maze_s> __l;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> opened;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> next_state;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  came_from;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  closed_value;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  closed;
  allocator_type local_1c9;
  int local_1c8;
  allocator_type local_1c1;
  HBF *local_1c0;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_1b8;
  int local_19c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_198;
  maze_s local_190;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_170;
  vector<int,_std::allocator<int>_> local_158;
  vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  vector<int,_std::allocator<int>_> *local_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double dStack_f0;
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  local_e0;
  undefined8 local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  maze_path *local_a8;
  long local_a0;
  double local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  iVar23 = this->NUM_THETA_CELLS;
  pvVar3 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar20 = *(long *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar4 = *(pointer *)
            ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  local_1c0 = this;
  local_198 = grid;
  local_110 = goal;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_140,
             ((long)(grid->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
             -0x5555555555555555,(allocator_type *)&local_158);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            *)&local_190,(long)piVar4 - lVar20 >> 2,&local_140,(allocator_type *)&local_1b8);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector(&local_e0,(long)iVar23,(value_type *)&local_190,(allocator_type *)&local_170);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             *)&local_190);
  if (local_140.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar23 = local_1c0->NUM_THETA_CELLS;
  pvVar3 = (local_198->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar20 = *(long *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar4 = *(pointer *)
            ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_158,
             ((long)(local_198->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
             -0x5555555555555555,(allocator_type *)&local_1b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_190,(long)piVar4 - lVar20 >> 2,&local_158,(allocator_type *)&local_170);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
            *)&local_140,(long)iVar23,(value_type *)&local_190,&local_1c9);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_190);
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar23 = local_1c0->NUM_THETA_CELLS;
  pvVar3 = (local_198->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar20 = *(long *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data;
  piVar4 = *(pointer *)
            ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data + 8);
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_1b8,
             ((long)(local_198->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
             -0x5555555555555555,(allocator_type *)&local_170);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
            *)&local_190,(long)piVar4 - lVar20 >> 2,&local_1b8,(allocator_type *)&local_1c9);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
            *)&local_158,(long)iVar23,(value_type *)&local_190,&local_1c1);
  std::
  vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
  ::~vector((vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
             *)&local_190);
  if (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start != (maze_s *)0x0) {
    operator_delete(local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  dVar25 = fmod((start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[2] + 6.283185307179586,6.283185307179586);
  iVar23 = local_1c0->NUM_THETA_CELLS;
  dVar25 = round((dVar25 * (double)iVar23) / 6.283185307179586);
  pdVar5 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar16 = (long)((int)dVar25 % iVar23);
  pvVar6 = local_e0.
           super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar16].
           super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = *pdVar5;
  dStack_c0 = pdVar5[1];
  dVar25 = floor(local_c8);
  lVar17 = (long)(int)dVar25 * 0x18;
  local_78 = dStack_c0;
  uStack_70 = dStack_c0;
  dVar26 = floor(dStack_c0);
  lVar20 = *(long *)&pvVar6[(int)dVar25].
                     super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                     super__Vector_impl_data;
  lVar18 = (long)(int)dVar26 * 0x20;
  *(undefined8 *)(lVar20 + lVar18) = 0;
  pdVar5 = (double *)(lVar20 + 8 + lVar18);
  *pdVar5 = local_c8;
  pdVar5[1] = dStack_c0;
  *(undefined4 *)
   (*(long *)((long)(&(local_140.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                       _M_impl.super__Vector_impl_data._M_start)->g)[lVar16 * 3] + lVar17) +
   (long)(int)dVar26 * 4) = 1;
  lVar20 = *(long *)(*(long *)(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar16 * 6) + lVar17);
  *(undefined8 *)(lVar20 + lVar18) = 0;
  pdVar5 = (double *)(lVar20 + 8 + lVar18);
  *pdVar5 = local_c8;
  pdVar5[1] = dStack_c0;
  local_190.g = 0.0;
  local_190.x = local_c8;
  local_190.y = dStack_c0;
  __l._M_len = 1;
  __l._M_array = &local_190;
  std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::vector
            (&local_1b8,__l,(allocator_type *)&local_170);
  if (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_19c = 1;
    local_a8 = __return_storage_ptr__;
    do {
      __return_storage_ptr__ = local_a8;
      pmVar11 = local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pmVar22 = local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = (long)local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl
                     .super__Vector_impl_data._M_start >> 5;
      lVar20 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<HBF::maze_s*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<comparator>>
                (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<HBF::maze_s*,std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>>,__gnu_cxx::__ops::_Iter_comp_iter<comparator>>
                (pmVar22,pmVar11);
      local_108 = (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_start)->g;
      dStack_100 = (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start)->x;
      local_128 = (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_start)->y;
      uStack_120 = (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start)->theta;
      __src = local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
      if (__src != local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
        memmove(local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                super__Vector_impl_data._M_start,__src,
                (long)local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      }
      local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      local_b8 = dStack_100;
      dStack_b0 = dStack_100;
      iVar23 = (int)dStack_100;
      iVar19 = (int)local_128;
      piVar7 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((*piVar7 == iVar23) && (piVar7[1] == iVar19)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"found path to goal in ",0x16);
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_19c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," expansions",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        (__return_storage_ptr__->came_from).
        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->came_from).
        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->closed).
        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->came_from).
        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->closed).
        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->closed).
        super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ::operator=(&__return_storage_ptr__->closed,&local_e0);
        std::
        vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
        ::operator=(&__return_storage_ptr__->came_from,
                    (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                     *)&local_158);
        (__return_storage_ptr__->final).g = local_108;
        lVar20 = 0x48;
        lVar17 = 0x40;
        lVar16 = 0x38;
        uVar31 = (undefined4)local_128;
        uVar32 = local_128._4_4_;
        dVar25 = local_b8;
        uVar24 = (undefined4)uStack_120;
        uVar30 = uStack_120._4_4_;
        goto LAB_00103d25;
      }
      local_58 = local_108;
      dStack_50 = dStack_100;
      local_48 = local_128;
      dStack_40 = uStack_120;
      state.x = dStack_100;
      state.g = local_108;
      state.y = local_128;
      state.theta = uStack_120;
      expand(&local_170,local_1c0,state);
      if (local_170.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_170.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_b8 = (double)CONCAT44(local_b8._4_4_,iVar19);
        local_68 = uStack_120 + 6.283185307179586;
        dStack_60 = uStack_120;
        lVar20 = 0;
        uVar12 = 0;
        local_1c8 = iVar23;
        do {
          piVar7 = (local_110->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar14 = iVar23 - *piVar7;
          iVar19 = -iVar14;
          if (0 < iVar14) {
            iVar19 = iVar14;
          }
          iVar15 = local_b8._0_4_ - piVar7[1];
          iVar14 = -iVar15;
          if (0 < iVar15) {
            iVar14 = iVar15;
          }
          dVar25 = fmod(local_68,6.283185307179586);
          iVar15 = local_1c0->NUM_THETA_CELLS;
          dVar27 = round((dVar25 * (double)iVar15) / 6.283185307179586);
          pdVar5 = (double *)
                   ((long)&(local_170.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                            _M_impl.super__Vector_impl_data._M_start)->x + lVar20);
          dVar25 = *pdVar5;
          dVar26 = pdVar5[1];
          if (0.0 <= dVar25) {
            pvVar3 = (local_198->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar17 = ((long)(local_198->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
                     -0x5555555555555555;
            auVar28._8_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar28._0_8_ = lVar17;
            auVar28._12_4_ = 0x45300000;
            if (((dVar25 < (auVar28._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) &&
                (0.0 <= dVar26)) &&
               (lVar17 = (long)*(pointer *)
                                ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data + 8) -
                         *(long *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data, lVar16 = lVar17 >> 2,
               auVar29._8_4_ = (int)(lVar17 >> 0x22), auVar29._0_8_ = lVar16,
               auVar29._12_4_ = 0x45300000,
               dVar26 < (auVar29._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0))) {
              dVar27 = (double)(((int)dVar27 % iVar15) / 0xf);
              local_90 = SQRT(dVar27 * dVar27 +
                              (double)iVar14 * (double)iVar14 + (double)iVar19 * (double)iVar19) +
                         *(double *)
                          ((long)&(local_170.
                                   super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->g + lVar20);
              local_98 = *(double *)
                          ((long)&(local_170.
                                   super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->theta + lVar20);
              local_f8 = dVar26;
              dStack_f0 = dVar26;
              local_88 = dVar25;
              dStack_80 = dVar26;
              dVar25 = fmod(local_98 + 6.283185307179586,6.283185307179586);
              iVar23 = local_1c0->NUM_THETA_CELLS;
              dVar25 = round((dVar25 * (double)iVar23) / 6.283185307179586);
              pmVar22 = local_140.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar17 = (long)((int)dVar25 % iVar23);
              local_a0 = lVar17;
              dVar25 = floor(local_88);
              dVar26 = (double)(long)(int)dVar25;
              dVar25 = (&pmVar22->g)[lVar17 * 3];
              dVar27 = floor(local_f8);
              lVar17 = local_a0;
              lVar16 = (long)(int)dVar27;
              iVar23 = local_1c8;
              if ((*(int *)(*(long *)((long)dVar25 + (long)dVar26 * 0x18) + lVar16 * 4) == 0) &&
                 (local_f8 = dVar26,
                 *(int *)(*(long *)&(local_198->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[(long)dVar26].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + lVar16 * 4) == 0)) {
                local_190.g = local_90;
                local_190.x = local_88;
                local_190.y = dStack_80;
                local_190.theta = local_98;
                if (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>::
                  _M_realloc_insert<HBF::maze_s_const&>
                            ((vector<HBF::maze_s,std::allocator<HBF::maze_s>> *)&local_1b8,
                             (iterator)
                             local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_190);
                  pmVar22 = local_140.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->y = dStack_80;
                  (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->theta = local_98;
                  (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->g = local_90;
                  (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                   super__Vector_impl_data._M_finish)->x = local_88;
                  local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                lVar18 = *(long *)&local_e0.
                                   super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar17].
                                   super__Vector_base<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)local_f8].
                                   super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                   _M_impl.super__Vector_impl_data;
                lVar21 = lVar16 * 0x20;
                puVar1 = (undefined8 *)
                         ((long)&(local_170.
                                  super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->g + lVar20);
                uVar8 = *puVar1;
                uVar9 = puVar1[1];
                puVar1 = (undefined8 *)
                         ((long)&(local_170.
                                  super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->y + lVar20);
                uVar10 = puVar1[1];
                puVar2 = (undefined8 *)(lVar18 + 0x10 + lVar21);
                *puVar2 = *puVar1;
                puVar2[1] = uVar10;
                puVar1 = (undefined8 *)(lVar18 + lVar21);
                *puVar1 = uVar8;
                puVar1[1] = uVar9;
                *(undefined4 *)
                 (*(long *)((long)(&pmVar22->g)[lVar17 * 3] + (long)local_f8 * 0x18) + lVar16 * 4) =
                     1;
                lVar17 = *(long *)(*(long *)(local_158.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar17 * 6)
                                  + (long)local_f8 * 0x18);
                pdVar5 = (double *)(lVar17 + lVar21);
                *pdVar5 = local_108;
                pdVar5[1] = dStack_100;
                pdVar5 = (double *)(lVar17 + 0x10 + lVar21);
                *pdVar5 = local_128;
                pdVar5[1] = uStack_120;
                local_19c = local_19c + 1;
                iVar23 = local_1c8;
              }
            }
          }
          uVar12 = uVar12 + 1;
          lVar20 = lVar20 + 0x20;
        } while (uVar12 < (ulong)((long)local_170.
                                        super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_170.
                                        super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (local_170.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      __return_storage_ptr__ = local_a8;
    } while (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no valid path.",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  (__return_storage_ptr__->came_from).
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->came_from).
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->closed).
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->came_from).
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->closed).
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->closed).
  super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::operator=(&__return_storage_ptr__->closed,&local_e0);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::operator=(&__return_storage_ptr__->came_from,
              (vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
               *)&local_158);
  lVar20 = 0x40;
  lVar17 = 0x38;
  lVar16 = 0x30;
  uVar31 = (undefined4)local_c8;
  uVar32 = local_c8._4_4_;
  dVar25 = 0.0;
  uVar24 = (undefined4)uStack_70;
  uVar30 = uStack_70._4_4_;
LAB_00103d25:
  *(double *)
   ((long)&(__return_storage_ptr__->closed).
           super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + lVar16) = dVar25;
  *(ulong *)((long)&(__return_storage_ptr__->closed).
                    super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar17) = CONCAT44(uVar32,uVar31);
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->closed).
           super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + lVar20) = uVar24;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->closed).
           super__Vector_base<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + lVar20 + 4) = uVar30;
  if (local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
      super__Vector_impl_data._M_start != (maze_s *)0x0) {
    operator_delete(local_1b8.super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
             *)&local_158);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
             *)&local_140);
  std::
  vector<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>,_std::allocator<std::vector<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>,_std::allocator<std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>_>_>_>_>
  ::~vector(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

HBF::maze_path HBF::search(vector<vector<int> > grid, vector<double> start, vector<int> goal) {
    /*
    Working Implementation of breadth first search. Does NOT use a heuristic
    and as a result this is pretty inefficient. Try modifying this algorithm
    into hybrid A* by adding heuristics appropriately.
    */

    vector<vector<vector<maze_s> > > closed(NUM_THETA_CELLS,
                                            vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    vector<vector<vector<int> > > closed_value(NUM_THETA_CELLS,
                                               vector<vector<int>>(grid[0].size(), vector<int>(grid.size())));
    vector<vector<vector<maze_s> > > came_from(NUM_THETA_CELLS,
                                               vector<vector<maze_s>>(grid[0].size(), vector<maze_s>(grid.size())));
    double theta = start[2];
    int stack = theta_to_stack_number(theta);
    double g = 0;

    maze_s state;
    state.g = g;
    state.x = start[0];
    state.y = start[1];

    closed[stack][idx(state.x)][idx(state.y)] = state;
    closed_value[stack][idx(state.x)][idx(state.y)] = 1;
    came_from[stack][idx(state.x)][idx(state.y)] = state;
    int total_closed = 1;
    vector<maze_s> opened = {state};
    bool finished = false;

    // add my heuristic function
    // If you have one h value per cell then multiple states in that cell will have the same g+h value,
    // making it difficult to determine which is the better state.

//    vector<vector<int> > heuristic = heuristic_basic(grid, start, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_euclidean(grid, goal);
//    vector<vector<double> > heuristic = heuristic_nhh_manhattan(grid, goal);


    while (!opened.empty()) {

        int length = opened.size();
        sort(opened.begin(), opened.end(), comparator());


        maze_s next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next.x;
        int y = next.y;

        if (idx(x) == goal[0] && idx(y) == goal[1]) {
            cout << "found path to goal in " << total_closed << " expansions" << endl;
            maze_path path;
            path.closed = closed;
            path.came_from = came_from;
            path.final = next;
            return path;

        }
        vector<maze_s> next_state = expand(next);

        for (int i = 0; i < next_state.size(); i++) {
            double h;
//            h = heuristic[x][y];
            h = sqrt(pow(abs(x-goal[0]),2)+pow(abs(y-goal[1]),2)+pow(theta_to_stack_number(next.theta)/15,2));
//            h = 0;
            double g2 = next_state[i].g + h;
            double x2 = next_state[i].x;
            double y2 = next_state[i].y;
            double theta2 = next_state[i].theta;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }
            int stack2 = theta_to_stack_number(theta2);

            if (closed_value[stack2][idx(x2)][idx(y2)] == 0 && grid[idx(x2)][idx(y2)] == 0) {

                maze_s state2;
                state2.g = g2;
                state2.x = x2;
                state2.y = y2;
                state2.theta = theta2;

                opened.push_back(state2);

                closed[stack2][idx(x2)][idx(y2)] = next_state[i];
                closed_value[stack2][idx(x2)][idx(y2)] = 1;
                came_from[stack2][idx(x2)][idx(y2)] = next;
                total_closed += 1;
            }


        }

    }
    cout << "no valid path." << endl;
    HBF::maze_path path;
    path.closed = closed;
    path.came_from = came_from;
    path.final = state;
    return path;

}